

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d998::OpenGLGraphicsPlugin::CheckShader
          (OpenGLGraphicsPlugin *this,GLuint shader)

{
  GLsizei length;
  GLint r;
  GLchar msg [4096];
  GLsizei local_1040;
  GLint local_103c;
  string local_1038;
  GLchar local_1018 [4104];
  
  local_103c = 0;
  (*glGetShaderiv)((GLuint)this,0x8b81,&local_103c);
  if (local_103c != 0) {
    return;
  }
  memset(local_1018,0,0x1000);
  (*glGetShaderInfoLog)((GLuint)this,0x1000,&local_1040,local_1018);
  Fmt_abi_cxx11_(&local_1038,"Compile shader failed: %s",local_1018);
  Throw(&local_1038,(char *)0x0,
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:216"
       );
}

Assistant:

void CheckShader(GLuint shader) {
        GLint r = 0;
        glGetShaderiv(shader, GL_COMPILE_STATUS, &r);
        if (r == GL_FALSE) {
            GLchar msg[4096] = {};
            GLsizei length;
            glGetShaderInfoLog(shader, sizeof(msg), &length, msg);
            THROW(Fmt("Compile shader failed: %s", msg));
        }
    }